

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O0

void stbi__grow_buffer_unsafe(stbi__jpeg *j)

{
  byte bVar1;
  stbi_uc sVar2;
  uint local_1c;
  int c;
  uint b;
  stbi__jpeg *j_local;
  
  do {
    if (j->nomore == 0) {
      bVar1 = stbi__get8(j->s);
      local_1c = (uint)bVar1;
    }
    else {
      local_1c = 0;
    }
    if (local_1c == 0xff) {
      sVar2 = stbi__get8(j->s);
      while (sVar2 == 0xff) {
        sVar2 = stbi__get8(j->s);
      }
      if (sVar2 != '\0') {
        j->marker = sVar2;
        j->nomore = 1;
        return;
      }
    }
    j->code_buffer = local_1c << (0x18U - (char)j->code_bits & 0x1f) | j->code_buffer;
    j->code_bits = j->code_bits + 8;
    if (0x18 < j->code_bits) {
      return;
    }
  } while( true );
}

Assistant:

static void stbi__grow_buffer_unsafe(stbi__jpeg *j)
{
   do {
      unsigned int b = j->nomore ? 0 : stbi__get8(j->s);
      if (b == 0xff) {
         int c = stbi__get8(j->s);
         while (c == 0xff) c = stbi__get8(j->s); // consume fill bytes
         if (c != 0) {
            j->marker = (unsigned char) c;
            j->nomore = 1;
            return;
         }
      }
      j->code_buffer |= b << (24 - j->code_bits);
      j->code_bits += 8;
   } while (j->code_bits <= 24);
}